

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

void Llb_ManResultPrint(Aig_Man_t *p,Vec_Ptr_t *vResult)

{
  Vec_Ptr_t *vLower;
  bool bVar1;
  long lVar2;
  Vec_Ptr_t *vUpper;
  
  if (0 < (long)vResult->nSize) {
    lVar2 = (long)vResult->nSize;
    vUpper = (Vec_Ptr_t *)0x0;
    do {
      if (vResult->nSize < lVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      vLower = (Vec_Ptr_t *)vResult->pArray[lVar2 + -1];
      if (lVar2 < vResult->nSize) {
        Llb_ManCutPrint(p,vLower,vUpper);
      }
      bVar1 = 1 < lVar2;
      lVar2 = lVar2 + -1;
      vUpper = vLower;
    } while (bVar1);
  }
  return;
}

Assistant:

void Llb_ManResultPrint( Aig_Man_t * p, Vec_Ptr_t * vResult )
{
    Vec_Ptr_t * vLower, * vUpper = NULL;
    int i;
    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vResult, vLower, i )
    {
        if ( i < Vec_PtrSize(vResult) - 1 )
            Llb_ManCutPrint( p, vLower, vUpper );
        vUpper = vLower;
    }
}